

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAttributeUsePtr_conflict
xmlSchemaAddAttributeUse(xmlSchemaParserCtxtPtr pctxt,xmlNodePtr node)

{
  xmlSchemaAttributeUsePtr_conflict ret;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if (pctxt == (xmlSchemaParserCtxtPtr)0x0) {
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    pctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x48);
    if (pctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(pctxt,"allocating attribute",(xmlNodePtr)0x0);
      pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(pctxt_local,0,0x48);
      pctxt_local->type = 0x1a;
      pctxt_local->serror = (xmlStructuredErrorFunc)node;
      xmlSchemaAddItemSize(&pctxt->constructor->bucket->locals,10,pctxt_local);
    }
  }
  return (xmlSchemaAttributeUsePtr_conflict)pctxt_local;
}

Assistant:

static xmlSchemaAttributeUsePtr
xmlSchemaAddAttributeUse(xmlSchemaParserCtxtPtr pctxt,
			 xmlNodePtr node)
{
    xmlSchemaAttributeUsePtr ret = NULL;

    if (pctxt == NULL)
        return (NULL);

    ret = (xmlSchemaAttributeUsePtr) xmlMalloc(sizeof(xmlSchemaAttributeUse));
    if (ret == NULL) {
        xmlSchemaPErrMemory(pctxt, "allocating attribute", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaAttributeUse));
    ret->type = XML_SCHEMA_TYPE_ATTRIBUTE_USE;
    ret->node = node;

    WXS_ADD_LOCAL(pctxt, ret);
    return (ret);
}